

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O2

BUFFER_HANDLE Azure_Base64_Decode(char *source)

{
  int iVar1;
  size_t sVar2;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE handle;
  byte *pbVar4;
  size_t size;
  char *pcVar5;
  ulong uVar6;
  uchar c4;
  uchar c3;
  uchar c2;
  uchar c1;
  byte local_36;
  uchar c2_2;
  uchar c1_2;
  uchar c2_1;
  uchar c1_1;
  uchar local_31;
  
  if (source == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "invalid parameter const char* source=%p";
      iVar1 = 0xc1;
LAB_0013ad50:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                ,"Azure_Base64_Decode",iVar1,1,pcVar5);
      return (BUFFER_HANDLE)0x0;
    }
  }
  else {
    sVar2 = strlen(source);
    if ((sVar2 & 3) == 0) {
      handle = BUFFER_new();
      if (handle == (BUFFER_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Could not create a buffer to decoding.";
          iVar1 = 0xd1;
          goto LAB_0013ad50;
        }
      }
      else {
        sVar2 = strlen(source);
        if (sVar2 == 0) {
          return handle;
        }
        size = (sVar2 >> 2) * 3;
        if (source[sVar2 - 1] == '=') {
          size = size + ~(ulong)(source[sVar2 - 2] == '=');
        }
        if (size == 0) {
          return handle;
        }
        iVar1 = BUFFER_pre_build(handle,size);
        if (iVar1 == 0) {
          pbVar4 = BUFFER_u_char(handle);
          uVar6 = 0xffffffffffffffff;
          do {
            iVar1 = base64toValue(source[uVar6 + 1],&local_31);
            uVar6 = uVar6 + 1;
          } while (iVar1 != -1);
          for (; 3 < uVar6; uVar6 = uVar6 - 4) {
            base64toValue(*source,&c1);
            base64toValue(source[1],&c2);
            base64toValue(source[2],&c3);
            base64toValue(source[3],&c4);
            *pbVar4 = c2 >> 4 | c1 << 2;
            pbVar4[1] = c3 >> 2 | c2 << 4;
            pbVar4[2] = c3 << 6 | c4;
            source = source + 4;
            pbVar4 = pbVar4 + 3;
          }
          if (uVar6 != 3) {
            if (uVar6 != 2) {
              return handle;
            }
            base64toValue(*source,&c1_1);
            base64toValue(source[1],&c2_1);
            *pbVar4 = c2_1 >> 4 | c1_1 << 2;
            return handle;
          }
          base64toValue(*source,&c1_2);
          base64toValue(source[1],&c2_2);
          base64toValue(source[2],&local_36);
          *pbVar4 = c2_2 >> 4 | c1_2 << 2;
          pbVar4[1] = local_36 >> 2 | c2_2 << 4;
          return handle;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                    ,"Azure_Base64_Decode",0xdc,1,
                    "Could not prebuild a buffer for base 64 decoding.");
        }
        BUFFER_delete(handle);
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "Invalid length Base64 string!";
        iVar1 = 0xc9;
        goto LAB_0013ad50;
      }
    }
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE Azure_Base64_Decode(const char* source)
{
    BUFFER_HANDLE result;
    /*Codes_SRS_BASE64_06_008: [If source is NULL then Azure_Base64_Decode shall return NULL.]*/
    if (source == NULL)
    {
        LogError("invalid parameter const char* source=%p", source);
        result = NULL;
    }
    else
    {
        if ((strlen(source) % 4) != 0)
        {
            /*Codes_SRS_BASE64_06_011: [If the source string has an invalid length for a base 64 encoded string then Azure_Base64_Decode shall return NULL.]*/
            LogError("Invalid length Base64 string!");
            result = NULL;
        }
        else
        {
            if ((result = BUFFER_new()) == NULL)
            {
                /*Codes_SRS_BASE64_06_010: [If there is any memory allocation failure during the decode then Azure_Base64_Decode shall return NULL.]*/
                LogError("Could not create a buffer to decoding.");
            }
            else
            {
                size_t sizeOfOutputBuffer = Base64decode_len(source);
                /*Codes_SRS_BASE64_06_009: [If the string pointed to by source is zero length then the handle returned shall refer to a zero length buffer.]*/
                if (sizeOfOutputBuffer > 0)
                {
                    if (BUFFER_pre_build(result, sizeOfOutputBuffer) != 0)
                    {
                        /*Codes_SRS_BASE64_06_010: [If there is any memory allocation failure during the decode then Azure_Base64_Decode shall return NULL.]*/
                        LogError("Could not prebuild a buffer for base 64 decoding.");
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        Base64decode(BUFFER_u_char(result), source);
                    }
                }
            }
        }
    }
    return result;
}